

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O1

FxExpression * ParseParameter(FScanner *sc,PClassActor *cls,PType *type,bool constant)

{
  PClassActor *pPVar1;
  char *_statestring;
  PName *pPVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  FxMultiNameState *this;
  FxExpression *pFVar6;
  FxFloatCast *this_00;
  FxBoolCast *this_01;
  FxIntCast *this_02;
  FxConstant *this_03;
  FxRuntimeStateIndex *this_04;
  FScriptPosition *other;
  PName **ppPVar7;
  ExpVal val;
  undefined1 local_60 [16];
  FScriptPosition local_50;
  ExpVal local_40;
  
  if ((PType *)TypeSound == type) {
    FScanner::MustGetString(sc);
    this = (FxMultiNameState *)FMemArena::Alloc(&FxAlloc,0x38);
    iVar4 = S_FindSound(sc->String);
    FScriptPosition::FScriptPosition((FScriptPosition *)local_60,sc);
    (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
    FScriptPosition::FScriptPosition
              (&(this->super_FxExpression).ScriptPosition,(FScriptPosition *)local_60);
    (this->super_FxExpression).ValueType = (PType *)0x0;
    (this->super_FxExpression).isresolved = false;
    (this->super_FxExpression).NeedResult = true;
    (this->super_FxExpression).ExprType = EFX_Constant;
    (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_007113e8;
    ppPVar7 = (PName **)&TypeSound;
LAB_00542a4f:
    this->scope = (PClassActor *)TypeSInt32;
    *(undefined4 *)&(this->names).Array = 0;
    pPVar1 = (PClassActor *)*ppPVar7;
    this->scope = pPVar1;
    (this->super_FxExpression).ValueType = (PType *)pPVar1;
    *(int *)&(this->names).Array = iVar4;
    (this->super_FxExpression).isresolved = true;
  }
  else {
    if ((((PType *)TypeBool == type) || ((PType *)TypeSInt32 == type)) ||
       ((PType *)TypeFloat64 == type)) {
      pFVar6 = ParseExpression(sc,cls,constant);
      if ((constant) && (iVar4 = (*pFVar6->_vptr_FxExpression[3])(pFVar6), (char)iVar4 == '\0')) {
        FScanner::ScriptMessage(sc,"Default parameter must be constant.");
        FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
      }
      if ((PType *)TypeBool != type) {
        if ((PType *)TypeSInt32 != type) {
          this_00 = (FxFloatCast *)FMemArena::Alloc(&FxAlloc,0x30);
          FxFloatCast::FxFloatCast(this_00,pFVar6);
          return &this_00->super_FxExpression;
        }
        this_02 = (FxIntCast *)FMemArena::Alloc(&FxAlloc,0x38);
        FxIntCast::FxIntCast(this_02,pFVar6,true,false);
        return &this_02->super_FxExpression;
      }
      this_01 = (FxBoolCast *)FMemArena::Alloc(&FxAlloc,0x38);
      FxBoolCast::FxBoolCast(this_01,pFVar6,true);
      return &this_01->super_FxExpression;
    }
    ppPVar7 = &TypeName;
    if (((PType *)TypeName == type) || ((PType *)TypeString == type)) {
      FScanner::SetEscape(sc,true);
      FScanner::MustGetString(sc);
      iVar4 = 0;
      FScanner::SetEscape(sc,false);
      pPVar2 = TypeName;
      this = (FxMultiNameState *)FMemArena::Alloc(&FxAlloc,0x38);
      if ((PType *)pPVar2 != type) {
        strbin1((char *)&local_50);
        FScriptPosition::FScriptPosition((FScriptPosition *)local_60,sc);
        FxConstant::FxConstant((FxConstant *)this,&local_50.FileName,(FScriptPosition *)local_60);
        FString::~FString((FString *)local_60);
        other = &local_50;
        goto LAB_00542a72;
      }
      if (*sc->String != '\0') {
        iVar4 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
      }
      FScriptPosition::FScriptPosition((FScriptPosition *)local_60,sc);
      (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
      FScriptPosition::FScriptPosition
                (&(this->super_FxExpression).ScriptPosition,(FScriptPosition *)local_60);
      (this->super_FxExpression).ValueType = (PType *)0x0;
      (this->super_FxExpression).isresolved = false;
      (this->super_FxExpression).NeedResult = true;
      (this->super_FxExpression).ExprType = EFX_Constant;
      (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_007113e8;
      goto LAB_00542a4f;
    }
    if ((PType *)TypeColor == type) {
      FScanner::MustGetString(sc);
      bVar3 = FScanner::Compare(sc,"none");
      local_60._8_4_ = 0xffffffff;
      if (!bVar3) {
        bVar3 = FScanner::Compare(sc,(char *)"");
        local_60._8_4_ = 0;
        if (!bVar3) {
          uVar5 = V_GetColor((DWORD *)0x0,sc);
          local_60._8_4_ = uVar5 & 0xffffff | 0x1000000;
        }
      }
      other = (FScriptPosition *)(local_60 + 8);
      local_60._0_8_ = TypeColor;
      this = (FxMultiNameState *)FMemArena::Alloc(&FxAlloc,0x38);
      local_40.Type = (PType *)local_60._0_8_;
      if ((PString *)local_60._0_8_ == TypeString) {
        FString::AttachToOther((FString *)&local_40.field_1,(FString *)other);
      }
      else {
        local_40.field_1._4_4_ = local_60._12_4_;
        local_40.field_1.Int = local_60._8_4_;
      }
      FScriptPosition::FScriptPosition(&local_50,sc);
      FxConstant::FxConstant((FxConstant *)this,&local_40,&local_50);
      FString::~FString(&local_50.FileName);
      if (local_40.Type == (PType *)TypeString) {
        FString::~FString((FString *)&local_40.field_1);
      }
      if ((PString *)local_60._0_8_ != TypeString) {
        return &this->super_FxExpression;
      }
      goto LAB_00542a72;
    }
    if ((PType *)TypeStateLabel == type) {
      bVar3 = FScanner::CheckToken(sc,0x102);
      if (!bVar3) {
        if (constant) {
          FScanner::MustGetToken(sc,0x102);
          return (FxExpression *)0x0;
        }
        this_04 = (FxRuntimeStateIndex *)FMemArena::Alloc(&FxAlloc,0x38);
        pFVar6 = ParseExpression(sc,cls,false);
        FxRuntimeStateIndex::FxRuntimeStateIndex(this_04,pFVar6);
        return &this_04->super_FxExpression;
      }
      if ((*sc->String == '\0') || (bVar3 = FScanner::Compare(sc,"None"), bVar3)) {
        this_03 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x38);
        FScriptPosition::FScriptPosition((FScriptPosition *)local_60,sc);
        FxConstant::FxConstant(this_03,0,(FScriptPosition *)local_60);
        FString::~FString((FString *)local_60);
        (this_03->super_FxExpression).ValueType = (PType *)TypeStateLabel;
        return &this_03->super_FxExpression;
      }
      bVar3 = FScanner::Compare(sc,"*");
      if (bVar3) {
        FScanner::ScriptError(sc,"Invalid state name \'*\'");
        return (FxExpression *)0x0;
      }
      this = (FxMultiNameState *)FMemArena::Alloc(&FxAlloc,0x40);
      _statestring = sc->String;
      FScriptPosition::FScriptPosition((FScriptPosition *)local_60,sc);
      FxMultiNameState::FxMultiNameState(this,_statestring,(FScriptPosition *)local_60);
    }
    else {
      if ((type->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(type->super_PTypeBase).super_DObject._vptr_DObject)(type);
        (type->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
      }
      if ((type->super_PTypeBase).super_DObject.Class != PClassPointer::RegistrationInfo.MyClass) {
        __assert_fail("false && \"Unknown parameter type\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/decorate/thingdef_parse.cpp"
                      ,0xd3,"FxExpression *ParseParameter(FScanner &, PClassActor *, PType *, bool)"
                     );
      }
      FScanner::SetEscape(sc,true);
      FScanner::MustGetString(sc);
      FScanner::SetEscape(sc,false);
      this = (FxMultiNameState *)FMemArena::Alloc(&FxAlloc,0x38);
      pFVar6 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x38);
      iVar4 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
      FScriptPosition::FScriptPosition((FScriptPosition *)local_60,sc);
      pFVar6->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
      FScriptPosition::FScriptPosition(&pFVar6->ScriptPosition,(FScriptPosition *)local_60);
      pFVar6->ValueType = (PType *)0x0;
      pFVar6->isresolved = false;
      pFVar6->NeedResult = true;
      pFVar6->ExprType = EFX_Constant;
      pFVar6->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_007113e8;
      pFVar6[1]._vptr_FxExpression = (_func_int **)TypeSInt32;
      *(undefined4 *)&pFVar6[1].ScriptPosition.FileName.Chars = 0;
      pPVar2 = TypeName;
      pFVar6[1]._vptr_FxExpression = (_func_int **)TypeName;
      pFVar6->ValueType = (PType *)pPVar2;
      *(int *)&pFVar6[1].ScriptPosition.FileName.Chars = iVar4;
      pFVar6->isresolved = true;
      FxClassTypeCast::FxClassTypeCast((FxClassTypeCast *)this,(PClassPointer *)type,pFVar6);
    }
  }
  other = (FScriptPosition *)local_60;
LAB_00542a72:
  FString::~FString(&other->FileName);
  return &this->super_FxExpression;
}

Assistant:

FxExpression *ParseParameter(FScanner &sc, PClassActor *cls, PType *type, bool constant)
{
	FxExpression *x = NULL;
	int v;

	if (type == TypeSound)
	{
		sc.MustGetString();
		x = new FxConstant(FSoundID(sc.String), sc);
	}
	else if (type == TypeBool || type == TypeSInt32 || type == TypeFloat64)
	{
		x = ParseExpression (sc, cls, constant);
		if (constant && !x->isConstant())
		{
			sc.ScriptMessage("Default parameter must be constant.");
			FScriptPosition::ErrorCounter++;
		}
		// Do automatic coercion between bools, ints and floats.
		if (type == TypeBool)
		{
			x = new FxBoolCast(x);
		}
		else if (type == TypeSInt32)
		{
			x = new FxIntCast(x, true);
		}
		else
		{
			x = new FxFloatCast(x);
		}
	}
	else if (type == TypeName || type == TypeString)
	{
		sc.SetEscape(true);
		sc.MustGetString();
		sc.SetEscape(false);
		if (type == TypeName)
		{
			x = new FxConstant(sc.String[0] ? FName(sc.String) : NAME_None, sc);
		}
		else
		{
			x = new FxConstant(strbin1(sc.String), sc);
		}
	}
	else if (type == TypeColor)
	{
		sc.MustGetString ();
		if (sc.Compare("none"))
		{
			v = -1;
		}
		else if (sc.Compare(""))
		{
			v = 0;
		}
		else
		{
			int c = V_GetColor (NULL, sc);
			// 0 needs to be the default so we have to mark the color.
			v = MAKEARGB(1, RPART(c), GPART(c), BPART(c));
		}
		ExpVal val;
		val.Type = TypeColor;
		val.Int = v;
		x = new FxConstant(val, sc);
	}
	else if (type == TypeStateLabel)
	{
		// This forces quotation marks around the state name.
		if (sc.CheckToken(TK_StringConst))
		{
			if (sc.String[0] == 0 || sc.Compare("None"))
			{
				x = new FxConstant(0, sc);
				x->ValueType = TypeStateLabel;
			}
			else if (sc.Compare("*"))
			{
				sc.ScriptError("Invalid state name '*'");
			}
			else
			{
				x = new FxMultiNameState(sc.String, sc);
			}
		}
		else if (!constant)
		{
			x = new FxRuntimeStateIndex(ParseExpression(sc, cls));
		}
		else sc.MustGetToken(TK_StringConst); // This is for the error.
	}
	else if (type->GetClass() == RUNTIME_CLASS(PClassPointer))
	{	// Actor name
		sc.SetEscape(true);
		sc.MustGetString();
		sc.SetEscape(false);
		x = new FxClassTypeCast(static_cast<PClassPointer *>(type), new FxConstant(FName(sc.String), sc));
	}
	else
	{
		assert(false && "Unknown parameter type");
		x = NULL;
	}
	return x;
}